

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-expr.c
# Opt level: O1

int coda_expression_eval_integer(coda_expression *expr,coda_cursor *cursor,int64_t *value)

{
  int iVar1;
  int iVar2;
  char *message;
  eval_info info;
  eval_info local_368;
  
  if (expr->result_type == coda_expression_integer) {
    local_368.orig_cursor = cursor;
    if (cursor == (coda_cursor *)0x0) {
      if (expr->is_constant == 0) {
        message = "cursor argument may not be NULL if expression is not constant";
        goto LAB_0013ae24;
      }
    }
    else {
      memcpy(&local_368.cursor,cursor,0x310);
    }
    local_368.index[2] = 0;
    local_368.variable_index = 0;
    local_368.index[0] = 0;
    local_368.index[1] = 0;
    local_368.variable_name = (char *)0x0;
    iVar1 = eval_integer(&local_368,expr,value);
    if (iVar1 != 0 && cursor != (coda_cursor *)0x0) {
      iVar2 = coda_cursor_compare(cursor,&local_368.cursor);
      iVar1 = -1;
      if (iVar2 != 0) {
        coda_cursor_add_to_error_message(&local_368.cursor);
      }
    }
    else {
      iVar1 = -(uint)(iVar1 != 0);
    }
  }
  else {
    message = "expression is not an \'integer\' expression";
LAB_0013ae24:
    coda_set_error(-100,message);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

LIBCODA_API int coda_expression_eval_integer(const coda_expression *expr, const coda_cursor *cursor, int64_t *value)
{
    eval_info info;

    if (expr->result_type != coda_expression_integer)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "expression is not an 'integer' expression");
        return -1;
    }
    if (cursor == NULL && !expr->is_constant)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "cursor argument may not be NULL if expression is not constant");
        return -1;
    }

    init_eval_info(&info, cursor);
    if (eval_integer(&info, expr, value) != 0)
    {
        if (cursor != NULL && coda_cursor_compare(cursor, &info.cursor) != 0)
        {
            coda_cursor_add_to_error_message(&info.cursor);
        }
        return -1;
    }

    return 0;
}